

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * __thiscall
QUtil::hex_encode_char_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,char c)

{
  char cVar1;
  char cVar2;
  
  cVar1 = "0123456789abcdef"[((ulong)this & 0xff) >> 4];
  cVar2 = "0123456789abcdef"[(uint)this & 0xf];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '#';
  (__return_storage_ptr__->field_2)._M_local_buf[1] = cVar1;
  (__return_storage_ptr__->field_2)._M_local_buf[2] = cVar2;
  __return_storage_ptr__->_M_string_length = 3;
  (__return_storage_ptr__->field_2)._M_local_buf[3] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::hex_encode_char(char c)
{
    return util::hex_encode_char(c);
}